

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint _c;
  pointer pMVar3;
  size_t _elemsize;
  void *pvVar4;
  pointer pMVar5;
  size_t sVar6;
  int _c_00;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  size_t i_1;
  void *pvVar13;
  int iVar14;
  long lVar15;
  void *__dest;
  int j;
  int iVar16;
  size_t i_2;
  long lVar17;
  size_t i;
  ulong uVar18;
  bool bVar19;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar3->dims;
  _elemsize = pMVar3->elemsize;
  pvVar4 = (this->slices).data;
  if (uVar2 == 1) {
    iVar9 = pMVar3->w;
    lVar17 = 0;
    lVar15 = 0;
    uVar18 = 0;
    iVar12 = 0;
    while( true ) {
      pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48;
      if (uVar7 <= uVar18) break;
      iVar14 = *(int *)((long)pvVar4 + uVar18 * 4);
      if (iVar14 == -0xe9) {
        iVar14 = (int)((ulong)((long)iVar9 - (long)iVar12) / (uVar7 + lVar17));
      }
      Mat::create((Mat *)((long)&pMVar5->data + lVar15),iVar14,_elemsize,opt->blob_allocator);
      pvVar13 = *(void **)((long)&pMVar5->data + lVar15);
      if ((pvVar13 == (void *)0x0) ||
         ((long)*(int *)((long)&pMVar5->c + lVar15) * *(long *)((long)&pMVar5->cstep + lVar15) == 0)
         ) {
        return -100;
      }
      memcpy(pvVar13,(void *)(_elemsize * (long)iVar12 + (long)pMVar3->data),
             (long)iVar14 * _elemsize);
      iVar12 = iVar12 + iVar14;
      uVar18 = uVar18 + 1;
      lVar15 = lVar15 + 0x48;
      lVar17 = lVar17 + -1;
    }
  }
  else {
    iVar9 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar9 == 0)) {
      iVar9 = pMVar3->w;
      iVar12 = pMVar3->h;
      lVar17 = 0;
      lVar15 = 0;
      uVar18 = 0;
      iVar14 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48;
        if (uVar7 <= uVar18) break;
        iVar16 = *(int *)((long)pvVar4 + uVar18 * 4);
        if (iVar16 == -0xe9) {
          iVar16 = (int)((ulong)((long)iVar12 - (long)iVar14) / (uVar7 + lVar17));
        }
        Mat::create((Mat *)((long)&pMVar5->data + lVar15),iVar9,iVar16,_elemsize,opt->blob_allocator
                   );
        pvVar13 = *(void **)((long)&pMVar5->data + lVar15);
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar5->c + lVar15) * *(long *)((long)&pMVar5->cstep + lVar15) ==
            0) {
          return -100;
        }
        memcpy(pvVar13,(void *)((long)pMVar3->w * (long)iVar14 * pMVar3->elemsize +
                               (long)pMVar3->data),(long)(iVar16 * iVar9) * _elemsize);
        iVar14 = iVar14 + iVar16;
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x48;
        lVar17 = lVar17 + -1;
      }
    }
    else if ((uVar2 == 2) && (iVar9 == 1)) {
      iVar9 = pMVar3->w;
      uVar2 = pMVar3->h;
      uVar18 = 0;
      if (0 < (int)uVar2) {
        uVar18 = (ulong)uVar2;
      }
      uVar7 = 0;
      iVar12 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48;
        uVar10 = uVar8 - uVar7;
        if (uVar8 < uVar7 || uVar10 == 0) break;
        iVar14 = *(int *)((long)pvVar4 + uVar7 * 4);
        if (iVar14 == -0xe9) {
          iVar14 = (int)((ulong)((long)iVar9 - (long)iVar12) / uVar10);
        }
        pMVar1 = pMVar5 + uVar7;
        Mat::create(pMVar1,iVar14,uVar2,_elemsize,opt->blob_allocator);
        if (pMVar5[uVar7].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
          memcpy((void *)((long)pMVar1->w * uVar8 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)pMVar3->data +
                         (long)iVar12 * _elemsize + (long)pMVar3->w * uVar8 * pMVar3->elemsize),
                 (long)iVar14 * _elemsize);
        }
        iVar12 = iVar14 + iVar12;
        uVar7 = uVar7 + 1;
      }
    }
    else if ((uVar2 == 3) && (iVar9 == 0)) {
      iVar9 = pMVar3->w;
      iVar12 = pMVar3->h;
      iVar14 = pMVar3->c;
      lVar17 = 0;
      lVar15 = 0;
      uVar18 = 0;
      iVar16 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48;
        if (uVar7 <= uVar18) break;
        _c_00 = *(int *)((long)pvVar4 + uVar18 * 4);
        if (_c_00 == -0xe9) {
          _c_00 = (int)((ulong)((long)iVar14 - (long)iVar16) / (uVar7 + lVar17));
        }
        Mat::create((Mat *)((long)&pMVar5->data + lVar15),iVar9,iVar12,_c_00,_elemsize,
                    opt->blob_allocator);
        pvVar13 = *(void **)((long)&pMVar5->data + lVar15);
        if (pvVar13 == (void *)0x0) {
          return -100;
        }
        if ((long)*(int *)((long)&pMVar5->c + lVar15) * *(long *)((long)&pMVar5->cstep + lVar15) ==
            0) {
          return -100;
        }
        memcpy(pvVar13,(void *)(pMVar3->cstep * (long)iVar16 * pMVar3->elemsize + (long)pMVar3->data
                               ),(long)(_c_00 * (int)pMVar3->cstep) * _elemsize);
        iVar16 = iVar16 + _c_00;
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x48;
        lVar17 = lVar17 + -1;
      }
    }
    else if ((uVar2 == 3) && (iVar9 == 1)) {
      iVar9 = pMVar3->w;
      uVar2 = pMVar3->c;
      iVar12 = pMVar3->h;
      uVar18 = 0;
      if (0 < (int)uVar2) {
        uVar18 = (ulong)uVar2;
      }
      iVar14 = 0;
      uVar7 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48;
        uVar10 = uVar8 - uVar7;
        if (uVar8 < uVar7 || uVar10 == 0) break;
        iVar16 = *(int *)((long)pvVar4 + uVar7 * 4);
        if (iVar16 == -0xe9) {
          iVar16 = (int)((ulong)((long)iVar12 - (long)iVar14) / uVar10);
        }
        pMVar1 = pMVar5 + uVar7;
        Mat::create(pMVar1,iVar9,iVar16,uVar2,_elemsize,opt->blob_allocator);
        if (pMVar5[uVar7].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar8 = 0; uVar18 != uVar8; uVar8 = uVar8 + 1) {
          memcpy((void *)(pMVar1->cstep * uVar8 * pMVar1->elemsize + (long)pMVar1->data),
                 (void *)((long)pMVar3->data +
                         (long)pMVar3->w * (long)iVar14 * pMVar3->elemsize +
                         pMVar3->cstep * uVar8 * pMVar3->elemsize),
                 (long)(iVar16 * iVar9) * _elemsize);
        }
        iVar14 = iVar16 + iVar14;
        uVar7 = uVar7 + 1;
      }
    }
    else {
      if (uVar2 != 3) {
        return 0;
      }
      if (iVar9 != 2) {
        return 0;
      }
      iVar9 = pMVar3->w;
      uVar2 = pMVar3->h;
      _c = pMVar3->c;
      uVar18 = 0;
      if (0 < (int)uVar2) {
        uVar18 = (ulong)uVar2;
      }
      uVar7 = 0;
      if (0 < (int)_c) {
        uVar7 = (ulong)_c;
      }
      iVar12 = 0;
      uVar8 = 0;
      while( true ) {
        pMVar5 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x48;
        uVar11 = uVar10 - uVar8;
        if (uVar10 < uVar8 || uVar11 == 0) break;
        iVar14 = *(int *)((long)pvVar4 + uVar8 * 4);
        if (iVar14 == -0xe9) {
          iVar14 = (int)((ulong)((long)iVar9 - (long)iVar12) / uVar11);
        }
        pMVar1 = pMVar5 + uVar8;
        Mat::create(pMVar1,iVar14,uVar2,_c,_elemsize,opt->blob_allocator);
        if (pMVar5[uVar8].data == (void *)0x0) {
          return -100;
        }
        if ((long)pMVar1->c * pMVar1->cstep == 0) {
          return -100;
        }
        for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
          __dest = (void *)(pMVar1->cstep * uVar10 * pMVar1->elemsize + (long)pMVar1->data);
          iVar16 = pMVar3->w;
          sVar6 = pMVar3->elemsize;
          pvVar13 = (void *)((long)pMVar3->data +
                            sVar6 * pMVar3->cstep * uVar10 + (long)iVar12 * _elemsize);
          uVar11 = uVar18;
          while (bVar19 = uVar11 != 0, uVar11 = uVar11 - 1, bVar19) {
            memcpy(__dest,pvVar13,(long)iVar14 * _elemsize);
            __dest = (void *)((long)__dest + (long)iVar14 * _elemsize);
            pvVar13 = (void *)((long)pvVar13 + (long)iVar16 * sVar6);
          }
        }
        iVar12 = iVar14 + iVar12;
        uVar8 = uVar8 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).row<const unsigned char>(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < h; j++)
                {
                    const unsigned char* ptr = m.row<const unsigned char>(j) + q * elemsize;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice * elemsize;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}